

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O2

void kokkosp_init_library
               (int loadSeq,uint64_t interfaceVer,uint32_t devInfoCount,
               Kokkos_Profiling_KokkosPDeviceInfo *deviceInfo)

{
  KokkosTools::PerfettoConnector::kokkosp_init_library(loadSeq,interfaceVer,devInfoCount,deviceInfo)
  ;
  return;
}

Assistant:

void kokkosp_init_library(const int loadSeq, const uint64_t interfaceVer,
                          const uint32_t, void *) {
  std::cout << "-----------------------------------------------------------\n"
            << "KokkosP: Perfetto Connector (sequence is " << loadSeq
            << ", version: " << interfaceVer << ")\n"
            << "-----------------------------------------------------------\n";

  perfetto::TracingInitArgs args{};
  perfetto::TraceConfig cfg{};
  perfetto::protos::gen::TrackEventConfig track_event_cfg{};

  // default 10 MB shared memory and 1 GB buffer
  auto shmem_size_hint = get_env("KOKKOSP_PERFETTO_SHMEM_SIZE_HINT_KB", 10000);
  auto buffer_size = get_env("KOKKOSP_PERFETTO_BUFFER_SIZE_KB", 1000 * 1000);
  auto _fill_policy_name = get_env("KOKKOSP_PERFETTO_FILL_POLICY", "discard");

  if (std::getenv("KOKKOSP_PERFETTO_INPROCESS_BACKEND") &&
      std::stoi(std::getenv("KOKKOSP_PERFETTO_INPROCESS_BACKEND")) != 0)
    args.backends |= perfetto::kInProcessBackend;
  if (std::getenv("KOKKOSP_PERFETTO_SYSTEM_BACKEND") &&
      std::stoi(std::getenv("KOKKOSP_PERFETTO_SYSTEM_BACKEND")) != 0)
    args.backends |= perfetto::kInProcessBackend;

  if (args.backends == 0) args.backends |= perfetto::kInProcessBackend;

  auto _fill_policy =
      _fill_policy_name == "discard"
          ? perfetto::protos::gen::TraceConfig_BufferConfig_FillPolicy_DISCARD
          : perfetto::protos::gen::
                TraceConfig_BufferConfig_FillPolicy_RING_BUFFER;

  auto *buffer_config = cfg.add_buffers();
  buffer_config->set_size_kb(buffer_size);
  buffer_config->set_fill_policy(_fill_policy);

  auto *ds_cfg = cfg.add_data_sources()->mutable_config();
  ds_cfg->set_name("track_event");  // this MUST be track_event
  ds_cfg->set_track_event_config_raw(track_event_cfg.SerializeAsString());

  args.shmem_size_hint_kb = shmem_size_hint;

  perfetto::Tracing::Initialize(args);
  perfetto::TrackEvent::Register();

  tracing_session = perfetto::Tracing::NewTrace();
  tracing_session->Setup(cfg);
  tracing_session->StartBlocking();
}